

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

void __thiscall baryonyx::pnm_array::pnm_array(pnm_array *this,uint m,uint n)

{
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_20;
  uint local_18;
  uint local_14;
  uint n_local;
  uint m_local;
  pnm_array *this_local;
  
  local_18 = n;
  local_14 = m;
  _n_local = this;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this);
  this->m_width = local_18;
  this->m_heigth = local_14;
  if (this->m_width * this->m_heigth != 0) {
    size(this);
    std::make_unique<unsigned_char[]>((size_t)&local_20);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->m_buffer,&local_20);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_20);
  }
  return;
}

Assistant:

pnm_array(unsigned int m, unsigned int n)
      : m_width(n)
      , m_heigth(m)
    {
        if (m_width * m_heigth > 0)
            m_buffer = std::make_unique<std::uint8_t[]>(size());
    }